

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdset.c
# Opt level: O2

void TryRemovePollFd(fdset_s *self,sock fd)

{
  uint uVar1;
  int iVar2;
  pollfd *ppVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = self->nfds;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  while( true ) {
    if (uVar5 == uVar4) {
      return;
    }
    ppVar3 = self->pollFds;
    if (ppVar3[uVar4].fd == fd) break;
    uVar4 = uVar4 + 1;
  }
  memmove(ppVar3 + uVar4,ppVar3 + uVar4 + 1,(long)(int)(~(uint)uVar4 + uVar1) << 3);
  iVar2 = self->nfds;
  self->nfds = iVar2 + -1;
  if (0 < iVar2) {
    return;
  }
  __assert_fail("self->nfds >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/fdset.c"
                ,0x53,"void TryRemovePollFd(struct fdset_s *, sock)");
}

Assistant:

static
void TryRemovePollFd(struct fdset_s* self, sock fd)
{
    int pos = -1;
    int i = 0;
    for (; i < self->nfds; i++)
    {
        if(self->pollFds[i].fd == fd)
        {
            pos = i;
            break;
        }
    }

    if (pos != -1)
    {
        memmove(self->pollFds + pos, self->pollFds + pos + 1, sizeof(struct pollfd)*(self->nfds - pos - 1));
        self->nfds--;
        assert(self->nfds >= 0);
    }
}